

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlParseLookupSequence
              (htmlParserCtxtPtr ctxt,xmlChar first,xmlChar next,xmlChar third,int ignoreattrval)

{
  xmlParserInputPtr pxVar1;
  size_t sVar2;
  bool bVar3;
  xmlChar local_3d;
  char valdellim;
  xmlChar *pxStack_38;
  int invalue;
  xmlChar *buf;
  htmlParserInputPtr in;
  int len;
  int base;
  int ignoreattrval_local;
  xmlChar third_local;
  xmlChar next_local;
  xmlChar first_local;
  htmlParserCtxtPtr ctxt_local;
  
  bVar3 = false;
  local_3d = '\0';
  pxVar1 = ctxt->input;
  if ((pxVar1 != (xmlParserInputPtr)0x0) &&
     (in._4_4_ = (int)pxVar1->cur - (int)pxVar1->base, -1 < in._4_4_)) {
    if ((long)in._4_4_ < ctxt->checkIndex) {
      in._4_4_ = (int)ctxt->checkIndex;
      bVar3 = (ctxt->hasPErefs & 1U) != 0;
    }
    if (pxVar1->buf == (xmlParserInputBufferPtr)0x0) {
      pxStack_38 = pxVar1->base;
      in._0_4_ = pxVar1->length;
    }
    else {
      pxStack_38 = xmlBufContent(pxVar1->buf->buffer);
      sVar2 = xmlBufUse(pxVar1->buf->buffer);
      in._0_4_ = (int)sVar2;
    }
    if (third == '\0') {
      if (next != '\0') {
        in._0_4_ = (int)in + -1;
      }
    }
    else {
      in._0_4_ = (int)in + -2;
    }
    for (; in._4_4_ < (int)in; in._4_4_ = in._4_4_ + 1) {
      if (ignoreattrval == 0) {
LAB_00166ec5:
        if (pxStack_38[in._4_4_] == first) {
          if (third == '\0') {
            if ((next == '\0') || (pxStack_38[in._4_4_ + 1] == next)) goto LAB_00166f44;
          }
          else if ((pxStack_38[in._4_4_ + 1] == next) && (pxStack_38[in._4_4_ + 2] == third)) {
LAB_00166f44:
            ctxt->checkIndex = 0;
            return in._4_4_ - ((int)pxVar1->cur - (int)pxVar1->base);
          }
        }
      }
      else if ((pxStack_38[in._4_4_] == '\"') || (pxStack_38[in._4_4_] == '\'')) {
        if (bVar3) {
          if ((uint)pxStack_38[in._4_4_] != (int)(char)local_3d) goto LAB_00166ec5;
          bVar3 = false;
        }
        else {
          local_3d = pxStack_38[in._4_4_];
          bVar3 = true;
        }
      }
      else if (!bVar3) goto LAB_00166ec5;
    }
    ctxt->checkIndex = (long)in._4_4_;
    if (bVar3) {
      ctxt->hasPErefs = ctxt->hasPErefs | 1;
    }
    else {
      ctxt->hasPErefs = ctxt->hasPErefs & 0xfffffffe;
    }
  }
  return -1;
}

Assistant:

static int
htmlParseLookupSequence(htmlParserCtxtPtr ctxt, xmlChar first,
                        xmlChar next, xmlChar third, int ignoreattrval)
{
    int base, len;
    htmlParserInputPtr in;
    const xmlChar *buf;
    int invalue = 0;
    char valdellim = 0x0;

    in = ctxt->input;
    if (in == NULL)
        return (-1);

    base = in->cur - in->base;
    if (base < 0)
        return (-1);

    if (ctxt->checkIndex > base) {
        base = ctxt->checkIndex;
        /* Abuse hasPErefs member to restore current state. */
        invalue = ctxt->hasPErefs & 1 ? 1 : 0;
    }

    if (in->buf == NULL) {
        buf = in->base;
        len = in->length;
    } else {
        buf = xmlBufContent(in->buf->buffer);
        len = xmlBufUse(in->buf->buffer);
    }

    /* take into account the sequence length */
    if (third)
        len -= 2;
    else if (next)
        len--;
    for (; base < len; base++) {
        if (ignoreattrval) {
            if (buf[base] == '"' || buf[base] == '\'') {
                if (invalue) {
                    if (buf[base] == valdellim) {
                        invalue = 0;
                        continue;
                    }
                } else {
                    valdellim = buf[base];
                    invalue = 1;
                    continue;
                }
            } else if (invalue) {
                continue;
            }
        }
        if (buf[base] == first) {
            if (third != 0) {
                if ((buf[base + 1] != next) || (buf[base + 2] != third))
                    continue;
            } else if (next != 0) {
                if (buf[base + 1] != next)
                    continue;
            }
            ctxt->checkIndex = 0;
#ifdef DEBUG_PUSH
            if (next == 0)
                xmlGenericError(xmlGenericErrorContext,
                                "HPP: lookup '%c' found at %d\n",
                                first, base);
            else if (third == 0)
                xmlGenericError(xmlGenericErrorContext,
                                "HPP: lookup '%c%c' found at %d\n",
                                first, next, base);
            else
                xmlGenericError(xmlGenericErrorContext,
                                "HPP: lookup '%c%c%c' found at %d\n",
                                first, next, third, base);
#endif
            return (base - (in->cur - in->base));
        }
    }
    ctxt->checkIndex = base;
    /* Abuse hasPErefs member to track current state. */
    if (invalue)
        ctxt->hasPErefs |= 1;
    else
        ctxt->hasPErefs &= ~1;
#ifdef DEBUG_PUSH
    if (next == 0)
        xmlGenericError(xmlGenericErrorContext,
                        "HPP: lookup '%c' failed\n", first);
    else if (third == 0)
        xmlGenericError(xmlGenericErrorContext,
                        "HPP: lookup '%c%c' failed\n", first, next);
    else
        xmlGenericError(xmlGenericErrorContext,
                        "HPP: lookup '%c%c%c' failed\n", first, next,
                        third);
#endif
    return (-1);
}